

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

void __thiscall
GlobOptBlockData::CloneBlockData
          (GlobOptBlockData *this,BasicBlock *toBlockContext,BasicBlock *fromBlock)

{
  code *pcVar1;
  bool bVar2;
  ValueHashTable<Sym_*,_Value_*> *pVVar3;
  ValueHashTable<ExprHash,_Value_*> *pVVar4;
  JitArenaAllocator *pJVar5;
  BVSparse<Memory::JitArenaAllocator> *pBVar6;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar7;
  undefined4 *puVar8;
  TrackAllocData local_250;
  code *local_228;
  undefined8 local_220;
  TrackAllocData local_218;
  code *local_1f0;
  undefined8 local_1e8;
  TrackAllocData local_1e0;
  code *local_1b8;
  undefined8 local_1b0;
  TrackAllocData local_1a8;
  code *local_180;
  undefined8 local_178;
  TrackAllocData local_170;
  code *local_148;
  undefined8 local_140;
  TrackAllocData local_138;
  code *local_110;
  undefined8 local_108;
  TrackAllocData local_100;
  code *local_d8;
  undefined8 local_d0;
  TrackAllocData local_c8;
  code *local_a0;
  undefined8 local_98;
  TrackAllocData local_90;
  code *local_68;
  undefined8 local_60;
  TrackAllocData local_58;
  JitArenaAllocator *local_30;
  JitArenaAllocator *alloc;
  GlobOptBlockData *fromData;
  BasicBlock *fromBlock_local;
  BasicBlock *toBlockContext_local;
  GlobOptBlockData *this_local;
  
  alloc = (JitArenaAllocator *)&fromBlock->globOptData;
  this->globOpt = (fromBlock->globOptData).globOpt;
  local_30 = this->globOpt->alloc;
  fromData = (GlobOptBlockData *)fromBlock;
  fromBlock_local = toBlockContext;
  toBlockContext_local = (BasicBlock *)this;
  pVVar3 = ValueHashTable<Sym_*,_Value_*>::Copy(((GlobOptBlockData *)alloc)->symToValueMap);
  this->symToValueMap = pVVar3;
  pVVar4 = ValueHashTable<ExprHash,_Value_*>::Copy
                     ((ValueHashTable<ExprHash,_Value_*> *)
                      (alloc->super_ArenaAllocator).
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                      super_Allocator.recoverMemoryFunc);
  this->exprToValueMap = pVVar4;
  GlobOpt::CloneValues(this->globOpt,fromBlock_local,this,(GlobOptBlockData *)alloc);
  bVar2 = GlobOpt::DoBoundCheckHoist(this->globOpt);
  if (bVar2) {
    GlobOpt::CloneBoundCheckHoistBlockData
              (this->globOpt,fromBlock_local,this,(BasicBlock *)fromData,(GlobOptBlockData *)alloc);
  }
  pJVar5 = local_30;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x100);
  pJVar5 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar5,&local_58);
  local_68 = Memory::JitArenaAllocator::Alloc;
  local_60 = 0;
  pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar5,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar6,local_30);
  this->liveFields = pBVar6;
  BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
            (this->liveFields,
             (BVSparse<Memory::JitArenaAllocator> *)
             (alloc->super_ArenaAllocator).
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
             super_ArenaData.bigBlocks);
  pJVar5 = local_30;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_90,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x103);
  pJVar5 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar5,&local_90);
  local_a0 = Memory::JitArenaAllocator::Alloc;
  local_98 = 0;
  pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar5,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar6,local_30);
  this->liveArrayValues = pBVar6;
  BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
            (this->liveArrayValues,
             (BVSparse<Memory::JitArenaAllocator> *)
             (alloc->super_ArenaAllocator).
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
             super_ArenaData.fullBlocks);
  pJVar5 = local_30;
  if ((alloc->super_ArenaAllocator).
      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_ArenaData.
      mallocBlocks != (ArenaMemoryBlock *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_c8,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
               ,0x108);
    pJVar5 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar5,&local_c8);
    local_d8 = Memory::JitArenaAllocator::Alloc;
    local_d0 = 0;
    pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)
             new<Memory::JitArenaAllocator>(0x20,pJVar5,0x4e98c0);
    BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar6,local_30);
    this->maybeWrittenTypeSyms = pBVar6;
    BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
              (this->maybeWrittenTypeSyms,
               (BVSparse<Memory::JitArenaAllocator> *)
               (alloc->super_ArenaAllocator).
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
               super_ArenaData.mallocBlocks);
  }
  pJVar5 = local_30;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_100,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x10c);
  pJVar5 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar5,&local_100);
  local_110 = Memory::JitArenaAllocator::Alloc;
  local_108 = 0;
  pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar5,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar6,local_30);
  this->isTempSrc = pBVar6;
  BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
            (this->isTempSrc,
             (BVSparse<Memory::JitArenaAllocator> *)
             (alloc->super_ArenaAllocator).
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
             super_ArenaData.pageAllocator);
  pJVar5 = local_30;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_138,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x10f);
  pJVar5 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar5,&local_138);
  local_148 = Memory::JitArenaAllocator::Alloc;
  local_140 = 0;
  pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar5,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar6,local_30);
  this->liveVarSyms = pBVar6;
  BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
            (this->liveVarSyms,
             (BVSparse<Memory::JitArenaAllocator> *)
             (alloc->super_ArenaAllocator).
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
             super_ArenaData.cacheBlockCurrent);
  pJVar5 = local_30;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_170,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x112);
  pJVar5 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar5,&local_170);
  local_180 = Memory::JitArenaAllocator::Alloc;
  local_178 = 0;
  pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar5,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar6,local_30);
  this->liveInt32Syms = pBVar6;
  BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
            (this->liveInt32Syms,
             *(BVSparse<Memory::JitArenaAllocator> **)
              &(alloc->super_ArenaAllocator).
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
               super_ArenaData.lockBlockList);
  pJVar5 = local_30;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_1a8,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x115);
  pJVar5 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar5,&local_1a8);
  local_1b8 = Memory::JitArenaAllocator::Alloc;
  local_1b0 = 0;
  pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar5,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar6,local_30);
  this->liveLossyInt32Syms = pBVar6;
  BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
            (this->liveLossyInt32Syms,
             (BVSparse<Memory::JitArenaAllocator> *)
             (alloc->super_ArenaAllocator).
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.cacheBlockEnd.
             ptr);
  pJVar5 = local_30;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_1e0,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x118);
  pJVar5 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar5,&local_1e0);
  local_1f0 = Memory::JitArenaAllocator::Alloc;
  local_1e8 = 0;
  pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar5,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar6,local_30);
  this->liveFloat64Syms = pBVar6;
  BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
            (this->liveFloat64Syms,
             (BVSparse<Memory::JitArenaAllocator> *)
             (alloc->super_ArenaAllocator).
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.largestHole);
  bVar2 = GlobOpt::TrackArgumentsObject(this->globOpt);
  if ((bVar2) &&
     (*(long *)&(alloc->super_ArenaAllocator).
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.blockState
      != 0)) {
    pBVar6 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                       (*(BVSparse<Memory::JitArenaAllocator> **)
                         &(alloc->super_ArenaAllocator).
                          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                          blockState,local_30);
    this->argObjSyms = pBVar6;
  }
  if (((alloc->super_ArenaAllocator).
       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.name == (LPCWSTR)0x0
      ) || (bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                              ((BVSparse<Memory::JitArenaAllocator> *)
                               (alloc->super_ArenaAllocator).
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .name), bVar2)) {
    if (((alloc->super_ArenaAllocator).
         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.memoryData !=
         (ArenaMemoryData *)0x0) &&
       (bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                          ((BVSparse<Memory::JitArenaAllocator> *)
                           (alloc->super_ArenaAllocator).
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                           memoryData), !bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x129,
                         "(fromData->canStoreTempObjectSyms == nullptr || fromData->canStoreTempObjectSyms->IsEmpty())"
                         ,
                         "fromData->canStoreTempObjectSyms == nullptr || fromData->canStoreTempObjectSyms->IsEmpty()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
  }
  else {
    pBVar6 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                       ((BVSparse<Memory::JitArenaAllocator> *)
                        (alloc->super_ArenaAllocator).
                        super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                        name,local_30);
    this->maybeTempObjectSyms = pBVar6;
    if (((alloc->super_ArenaAllocator).
         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.memoryData !=
         (ArenaMemoryData *)0x0) &&
       (bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                          ((BVSparse<Memory::JitArenaAllocator> *)
                           (alloc->super_ArenaAllocator).
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                           memoryData), !bVar2)) {
      pBVar6 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                         ((BVSparse<Memory::JitArenaAllocator> *)
                          (alloc->super_ArenaAllocator).
                          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                          memoryData,local_30);
      this->canStoreTempObjectSyms = pBVar6;
    }
  }
  pJVar5 = local_30;
  this->curFunc =
       *(Func **)&(alloc->super_ArenaAllocator).
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                  needsDelayFreeList;
  if (alloc[1].super_ArenaAllocator.
      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_ArenaData.
      bigBlocks == (BigBlock *)0x0) {
    this->callSequence = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  }
  else {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_218,
               (type_info *)&SListBase<IR::Opnd*,Memory::ArenaAllocator,RealCount>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
               ,0x12f);
    pJVar5 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar5,&local_218);
    local_228 = Memory::JitArenaAllocator::Alloc;
    local_220 = 0;
    this_00 = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
              new<Memory::JitArenaAllocator>(0x10,pJVar5,0x4e98c0);
    SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::SListBase(this_00);
    this->callSequence = this_00;
    SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::CopyTo
              ((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
               alloc[1].super_ArenaAllocator.
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
               super_ArenaData.bigBlocks,&local_30->super_ArenaAllocator,this->callSequence);
  }
  this->startCallCount =
       *(uint *)&alloc[1].super_ArenaAllocator.
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                 super_Allocator.outOfMemoryFunc;
  this->argOutCount =
       *(uint *)((long)&alloc[1].super_ArenaAllocator.
                        super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                        super_Allocator.outOfMemoryFunc + 4);
  this->totalOutParamCount =
       *(uint *)&alloc[1].super_ArenaAllocator.
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                 super_Allocator.recoverMemoryFunc;
  this->inlinedArgOutSize =
       *(uint *)&alloc[1].super_ArenaAllocator.
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                 super_ArenaData.lockBlockList;
  this->hasCSECandidates =
       (bool)(alloc[1].super_ArenaAllocator.
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
              super_ArenaData.field_0x2c & 1);
  if ((alloc[1].super_ArenaAllocator.
       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_ArenaData.
       fullBlocks == (BigBlock *)0x0) ||
     ((bVar2 = GlobOpt::IsLoopPrePass(this->globOpt), bVar2 &&
      (((*(ushort *)&fromBlock_local->field_0x18 >> 2 & 1) == 0 ||
       (fromBlock_local->loop != this->globOpt->rootLoopPrePass)))))) {
    this->stackLiteralInitFldDataMap = (StackLiteralInitFldDataMap *)0x0;
  }
  else {
    pBVar7 = JsUtil::
             BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::Clone((BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      *)alloc[1].super_ArenaAllocator.
                        super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                        super_ArenaData.fullBlocks);
    this->stackLiteralInitFldDataMap = pBVar7;
  }
  pJVar5 = local_30;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_250,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
             ,0x149);
  pJVar5 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar5,&local_250);
  pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar5,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar6,local_30);
  this->changedSyms = pBVar6;
  BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
            (this->changedSyms,
             (BVSparse<Memory::JitArenaAllocator> *)
             alloc[1].super_ArenaAllocator.
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
             super_ArenaData.cacheBlockCurrent);
  this->capturedValues =
       (CapturedValues *)
       alloc[1].super_ArenaAllocator.
       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_ArenaData.
       pageAllocator;
  if (this->capturedValues != (CapturedValues *)0x0) {
    CapturedValues::IncrementRefCount(this->capturedValues);
  }
  bVar2 = HasData((GlobOptBlockData *)alloc);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x151,"(fromData->HasData())","fromData->HasData()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  OnDataInitialized(this,local_30);
  return;
}

Assistant:

void GlobOptBlockData::CloneBlockData(BasicBlock *const toBlockContext, BasicBlock *const fromBlock)
{
    GlobOptBlockData *const fromData = &fromBlock->globOptData;

    this->globOpt = fromData->globOpt;

    JitArenaAllocator *const alloc = this->globOpt->alloc;

    this->symToValueMap = fromData->symToValueMap->Copy();
    this->exprToValueMap = fromData->exprToValueMap->Copy();

    // Clone the values as well to allow for flow-sensitive ValueInfo
    this->globOpt->CloneValues(toBlockContext, this, fromData);

    if(this->globOpt->DoBoundCheckHoist())
    {
        this->globOpt->CloneBoundCheckHoistBlockData(toBlockContext, this, fromBlock, fromData);
    }

    this->liveFields = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveFields->Copy(fromData->liveFields);

    this->liveArrayValues = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveArrayValues->Copy(fromData->liveArrayValues);

    if (fromData->maybeWrittenTypeSyms)
    {
        this->maybeWrittenTypeSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
        this->maybeWrittenTypeSyms->Copy(fromData->maybeWrittenTypeSyms);
    }

    this->isTempSrc = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->isTempSrc->Copy(fromData->isTempSrc);

    this->liveVarSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveVarSyms->Copy(fromData->liveVarSyms);

    this->liveInt32Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveInt32Syms->Copy(fromData->liveInt32Syms);

    this->liveLossyInt32Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveLossyInt32Syms->Copy(fromData->liveLossyInt32Syms);

    this->liveFloat64Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveFloat64Syms->Copy(fromData->liveFloat64Syms);

    if (this->globOpt->TrackArgumentsObject() && fromData->argObjSyms)
    {
        this->argObjSyms = fromData->argObjSyms->CopyNew(alloc);
    }
    if (fromData->maybeTempObjectSyms && !fromData->maybeTempObjectSyms->IsEmpty())
    {
        this->maybeTempObjectSyms = fromData->maybeTempObjectSyms->CopyNew(alloc);
        if (fromData->canStoreTempObjectSyms && !fromData->canStoreTempObjectSyms->IsEmpty())
        {
            this->canStoreTempObjectSyms = fromData->canStoreTempObjectSyms->CopyNew(alloc);
        }
    }
    else
    {
        Assert(fromData->canStoreTempObjectSyms == nullptr || fromData->canStoreTempObjectSyms->IsEmpty());
    }

    this->curFunc = fromData->curFunc;
    if (fromData->callSequence != nullptr)
    {
        this->callSequence = JitAnew(alloc, SListBase<IR::Opnd *>);
        fromData->callSequence->CopyTo(alloc, *(this->callSequence));
    }
    else
    {
        this->callSequence = nullptr;
    }

    this->startCallCount = fromData->startCallCount;
    this->argOutCount = fromData->argOutCount;
    this->totalOutParamCount = fromData->totalOutParamCount;
    this->inlinedArgOutSize = fromData->inlinedArgOutSize;
    this->hasCSECandidates = fromData->hasCSECandidates;

    // Although we don't need the data on loop pre pass, we need to do it for the loop header
    // because we capture the loop header bailout on loop prepass
    if (fromData->stackLiteralInitFldDataMap != nullptr &&
        (!this->globOpt->IsLoopPrePass() || (toBlockContext->isLoopHeader && toBlockContext->loop == this->globOpt->rootLoopPrePass)))
    {
        this->stackLiteralInitFldDataMap = fromData->stackLiteralInitFldDataMap->Clone();
    }
    else
    {
        this->stackLiteralInitFldDataMap = nullptr;
    }

    this->changedSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->changedSyms->Copy(fromData->changedSyms);
    this->capturedValues = fromData->capturedValues;
    if (this->capturedValues)
    {
        this->capturedValues->IncrementRefCount();
    }

    Assert(fromData->HasData());
    this->OnDataInitialized(alloc);
}